

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O2

void anon_unknown.dwarf_23ed29f::muladd3(limb_t *c0,limb_t *c1,limb_t *c2,limb_t *a,limb_t *b)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *b;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *a;
  uVar7 = SUB168(auVar4 * auVar5,8);
  uVar6 = SUB168(auVar4 * auVar5,0);
  uVar1 = *c0;
  *c0 = *c0 + uVar6;
  uVar6 = (ulong)CARRY8(uVar1,uVar6);
  uVar1 = *c1;
  uVar3 = *c1 + uVar7;
  *c1 = uVar3 + uVar6;
  *c2 = *c2 + (ulong)(CARRY8(uVar1,uVar7) || CARRY8(uVar3,uVar6));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void muladd3(limb_t& c0, limb_t& c1, limb_t& c2, const limb_t& a, const limb_t& b)
{
    double_limb_t t = (double_limb_t)a * b;
    limb_t th = t >> LIMB_SIZE;
    limb_t tl = t;

    c0 += tl;
    th += (c0 < tl) ? 1 : 0;
    c1 += th;
    c2 += (c1 < th) ? 1 : 0;
}